

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fileio_utils.cpp
# Opt level: O1

bool emptystr(string *input,string *comments)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __s;
  bool bVar1;
  long *plVar2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  undefined1 local_58 [8];
  regex emptyregex;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> local_28;
  
  std::operator+(&local_78,"^\\s*[",comments);
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_78);
  p_Var3 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(plVar2 + 2);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar2 == p_Var3) {
    local_28._vptr__Sp_counted_base = p_Var3->_vptr__Sp_counted_base;
    local_28._8_8_ = plVar2[3];
    emptyregex._M_automaton.
    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = &local_28;
  }
  else {
    local_28._vptr__Sp_counted_base = p_Var3->_vptr__Sp_counted_base;
    emptyregex._M_automaton.
    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)*plVar2;
  }
  *plVar2 = (long)p_Var3;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::basic_regex<char,std::__cxx11::regex_traits<char>>::
  basic_regex<std::char_traits<char>,std::allocator<char>>
            ((basic_regex<char,std::__cxx11::regex_traits<char>> *)local_58,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &emptyregex._M_automaton.
              super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
              ._M_refcount,0x10);
  if (emptyregex._M_automaton.
      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != &local_28) {
    operator_delete(emptyregex._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  __s._M_current = (input->_M_dataplus)._M_p;
  local_28._vptr__Sp_counted_base = (_func_int **)0x0;
  local_28._M_use_count = 0;
  local_28._M_weak_count = 0;
  emptyregex._M_automaton.
  super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  bVar1 = std::__detail::
          __regex_algo_impl<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>>,char,std::__cxx11::regex_traits<char>,(std::__detail::_RegexExecutorPolicy)0,true>
                    (__s,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          )(__s._M_current + input->_M_string_length),
                     (match_results<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::sub_match<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)&emptyregex._M_automaton.
                         super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_refcount,
                     (basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_58,0);
  if (emptyregex._M_automaton.
      super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    operator_delete(emptyregex._M_automaton.
                    super___shared_ptr<const_std::__detail::_NFA<std::__cxx11::regex_traits<char>_>,_(__gnu_cxx::_Lock_policy)2>
                    ._M_refcount._M_pi);
  }
  std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex
            ((basic_regex<char,_std::__cxx11::regex_traits<char>_> *)local_58);
  return bVar1;
}

Assistant:

bool emptystr(const string& input, const string& comments) {
  const regex emptyregex(R"(^\s*[)"+comments+R"(]+.*\n*$|^\s*\n*$)");
  return regex_match(input, emptyregex);
}